

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O2

void do_chdir(bsdtar_conflict *bsdtar)

{
  int iVar1;
  
  if (bsdtar->pending_chdir != (char *)0x0) {
    iVar1 = chdir(bsdtar->pending_chdir);
    if (iVar1 != 0) {
      lafe_errc(1,0,"could not chdir to \'%s\'\n");
    }
    free(bsdtar->pending_chdir);
    bsdtar->pending_chdir = (char *)0x0;
  }
  return;
}

Assistant:

void
do_chdir(struct bsdtar *bsdtar)
{
	if (bsdtar->pending_chdir == NULL)
		return;

	if (chdir(bsdtar->pending_chdir) != 0) {
		lafe_errc(1, 0, "could not chdir to '%s'\n",
		    bsdtar->pending_chdir);
	}
	free(bsdtar->pending_chdir);
	bsdtar->pending_chdir = NULL;
}